

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

Am_Constraint * __thiscall
Web_Constraint::Create(Web_Constraint *this,Am_Slot *param_1,Am_Slot *new_slot)

{
  Am_Web_Create_Proc *pAVar1;
  Am_Web_Data *pAVar2;
  Am_Web_Initialize_Proc *pAVar3;
  bool bVar4;
  Am_Web_Data *pAVar5;
  
  pAVar1 = this->owner->create_proc;
  if ((pAVar1 != (Am_Web_Create_Proc *)0x0) && (bVar4 = (*pAVar1)(new_slot), bVar4)) {
    pAVar5 = (Am_Web_Data *)operator_new(0x70);
    pAVar2 = this->owner;
    (pAVar5->interface).super_Am_Constraint.super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002e2860;
    (pAVar5->interface).owner = pAVar5;
    pAVar3 = pAVar2->initialize_proc;
    pAVar5->create_proc = pAVar2->create_proc;
    pAVar5->initialize_proc = pAVar3;
    pAVar5->validate_proc = pAVar2->validate_proc;
    pAVar5->prototype = pAVar2;
    pAVar5->child = (Am_Web_Data *)0x0;
    pAVar5->sibling = pAVar2->child;
    pAVar2->child = pAVar5;
    pAVar5->validating = false;
    pAVar5->initialized = false;
    pAVar5->valid = false;
    pAVar5->out_list = (Output_Port *)0x0;
    pAVar5->in_list = (Input_Port *)0x0;
    pAVar5->invalid_list = (Input_Port *)0x0;
    pAVar5->changed_first = (Input_Port *)0x0;
    pAVar5->changed_last = (Input_Port *)0x0;
    return &(pAVar5->interface).super_Am_Constraint;
  }
  return (Am_Constraint *)0x0;
}

Assistant:

Am_Constraint *
Web_Constraint::Create(const Am_Slot &, const Am_Slot &new_slot)
{
  if (owner->create_proc && owner->create_proc(new_slot))
    return *(new Am_Web_Data(owner));
  return nullptr;
}